

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O0

uint16 __thiscall
Js::FunctionExecutionStateMachine::GetSimpleJitExecutedIterations
          (FunctionExecutionStateMachine *this)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  ExecutionMode EVar4;
  undefined4 *puVar5;
  FunctionBody *this_00;
  FunctionEntryPointInfo *pFVar6;
  uint16 local_34;
  uint32 callCount;
  FunctionEntryPointInfo *simpleJitEntryPointInfo;
  FunctionExecutionStateMachine *this_local;
  
  if ((this->initializedExecutionModeAndLimits & 1U) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x136,"(initializedExecutionModeAndLimits)",
                                "initializedExecutionModeAndLimits");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  EVar4 = GetExecutionMode(this);
  if (EVar4 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                                ,0x137,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = Memory::WriteBarrierPtr<Js::FunctionBody>::operator->(&this->owner);
  pFVar6 = FunctionBody::GetSimpleJitEntryPointInfo(this_00);
  if (pFVar6 == (FunctionEntryPointInfo *)0x0) {
    return 0;
  }
  uVar1 = pFVar6->callsCount;
  if (this->simpleJitLimit == 0) {
    if (uVar1 == 0) goto LAB_00a4f6a5;
  }
  else if (uVar1 < this->simpleJitLimit) goto LAB_00a4f6a5;
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionExecutionStateMachine.cpp"
                              ,0x141,
                              "(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount)",
                              "simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar5 = 0;
LAB_00a4f6a5:
  if (uVar1 == 0) {
    local_34 = this->simpleJitLimit;
  }
  else {
    local_34 = (this->simpleJitLimit - (short)uVar1) - 1;
  }
  return local_34;
}

Assistant:

uint16 FunctionExecutionStateMachine::GetSimpleJitExecutedIterations() const
    {
        Assert(initializedExecutionModeAndLimits);
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);

        FunctionEntryPointInfo *const simpleJitEntryPointInfo = owner->GetSimpleJitEntryPointInfo();
        if (!simpleJitEntryPointInfo)
        {
            return 0;
        }

        // Simple JIT counts down and transitions on overflow
        const uint32 callCount = simpleJitEntryPointInfo->callsCount;
        Assert(simpleJitLimit == 0 ? callCount == 0 : simpleJitLimit > callCount);
        return callCount == 0 ?
            static_cast<uint16>(simpleJitLimit) :
            static_cast<uint16>(simpleJitLimit) - static_cast<uint16>(callCount) - 1;
    }